

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

CURLcode http2_disconnect(Curl_easy *data,connectdata *conn,_Bool dead_connection)

{
  nghttp2_session_del((conn->proto).httpc.h2);
  (*Curl_cfree)((conn->proto).ftpc.pp.statemachine);
  (conn->proto).ftpc.pp.statemachine = (_func_CURLcode_Curl_easy_ptr_connectdata_ptr *)0x0;
  return CURLE_OK;
}

Assistant:

static CURLcode http2_disconnect(struct Curl_easy *data,
                                 struct connectdata *conn,
                                 bool dead_connection)
{
  struct http_conn *c = &conn->proto.httpc;
  (void)dead_connection;
#ifndef DEBUG_HTTP2
  (void)data;
#endif

  H2BUGF(infof(data, "HTTP/2 DISCONNECT starts now"));

  nghttp2_session_del(c->h2);
  Curl_safefree(c->inbuf);

  H2BUGF(infof(data, "HTTP/2 DISCONNECT done"));

  return CURLE_OK;
}